

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O0

bool __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::CheckState
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this,RESOURCE_STATE State)

{
  bool bVar1;
  RESOURCE_STATE RVar2;
  Char *pCVar3;
  undefined1 local_68 [8];
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  RESOURCE_STATE State_local;
  TopLevelASBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = State;
  if ((State & State - RESOURCE_STATE_UNDEFINED) != RESOURCE_STATE_UNKNOWN) {
    FormatString<char[25]>((string *)local_38,(char (*) [25])"Single state is expected");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CheckState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0x12d);
    std::__cxx11::string::~string((string *)local_38);
  }
  bVar1 = IsInKnownState(this);
  if (!bVar1) {
    FormatString<char[22]>((string *)local_68,(char (*) [22])"TLAS state is unknown");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CheckState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0x12e);
    std::__cxx11::string::~string((string *)local_68);
  }
  RVar2 = Diligent::operator&(this->m_State,msg.field_2._12_4_);
  return RVar2 == msg.field_2._12_4_;
}

Assistant:

bool CheckState(RESOURCE_STATE State) const
    {
        VERIFY((State & (State - 1)) == 0, "Single state is expected");
        VERIFY(IsInKnownState(), "TLAS state is unknown");
        return (this->m_State & State) == State;
    }